

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_decompress.c
# Opt level: O0

size_t FSE_decompress_wksp_body_default
                 (void *dst,size_t dstCapacity,void *cSrc,size_t cSrcSize,uint maxLog,
                 void *workSpace,size_t wkspSize)

{
  BYTE *pBVar1;
  uchar uVar2;
  uint uVar3;
  BIT_DStream_status BVar4;
  size_t sVar5;
  size_t code;
  BYTE *pBVar6;
  byte bVar7;
  uchar *puVar8;
  BYTE *pBVar9;
  void *workSpace_local;
  uint maxLog_local;
  size_t cSrcSize_local;
  void *cSrc_local;
  size_t dstCapacity_local;
  void *dst_local;
  U32 fastMode;
  FSE_DTableHeader *DTableH;
  void *ptr;
  size_t _var_err__;
  size_t NCountLength;
  FSE_DecompressWksp *wksp;
  uint maxSymbolValue;
  uint tableLog;
  BYTE *ip;
  BYTE *istart;
  size_t local_198;
  void *local_190;
  uint local_184;
  size_t local_180;
  void *local_178;
  size_t local_170;
  BYTE *local_168;
  size_t local_160;
  size_t local_158;
  size_t _var_err___2;
  FSE_DState_t state2_1;
  FSE_DState_t state1_1;
  BIT_DStream_t bitD_1;
  BYTE *olimit_1;
  BYTE *omax_1;
  BYTE *op_1;
  BYTE *ostart_1;
  size_t local_b8;
  size_t _var_err___1;
  FSE_DState_t state2;
  FSE_DState_t state1;
  BIT_DStream_t bitD;
  BYTE *olimit;
  BYTE *omax;
  BYTE *op;
  BYTE *ostart;
  size_t local_10;
  
  local_198 = wkspSize;
  istart._4_4_ = 0;
  wksp._0_4_ = 0xff;
  if (wkspSize < 0x204) {
    local_160 = 0xffffffffffffffff;
  }
  else {
    _maxSymbolValue = cSrc;
    ip = (BYTE *)cSrc;
    local_190 = workSpace;
    local_184 = maxLog;
    local_180 = cSrcSize;
    local_178 = cSrc;
    local_170 = dstCapacity;
    local_168 = (BYTE *)dst;
    sVar5 = FSE_readNCount_bmi2((short *)workSpace,(uint *)&wksp,(uint *)((long)&wksp + 4),cSrc,
                                cSrcSize,0);
    uVar3 = ERR_isError(sVar5);
    local_160 = sVar5;
    if (uVar3 == 0) {
      if (local_184 < wksp._4_4_) {
        local_160 = 0xffffffffffffffd4;
      }
      else {
        _maxSymbolValue = (void *)(sVar5 + (long)_maxSymbolValue);
        local_180 = local_180 - sVar5;
        bVar7 = (byte)wksp._4_4_;
        if (local_198 <
            ((long)((1 << (bVar7 & 0x1f)) + 1) +
             ((ulong)((uint)wksp + 1) * 2 + (1L << (bVar7 & 0x3f)) + 0xb >> 2) + 0x81) * 4) {
          local_160 = 0xffffffffffffffd4;
        }
        else {
          local_190 = (void *)((long)workSpace + (long)((1 << (bVar7 & 0x1f)) + 1) * 4 + 0x200);
          local_198 = local_198 - ((long)((1 << (bVar7 & 0x1f)) + 1) * 4 + 0x204);
          code = FSE_buildDTable_internal
                           ((FSE_DTable *)((long)workSpace + 0x200),(short *)workSpace,(uint)wksp,
                            wksp._4_4_,local_190,local_198);
          uVar3 = ERR_isError(code);
          pBVar1 = local_168;
          sVar5 = local_170;
          local_160 = code;
          if (uVar3 == 0) {
            if (*(short *)((long)workSpace + 0x202) == 0) {
              omax_1 = local_168;
              pBVar6 = local_168 + (local_170 - 3);
              local_158 = BIT_initDStream((BIT_DStream_t *)&state1_1.table,_maxSymbolValue,local_180
                                         );
              uVar3 = ERR_isError(local_158);
              if (uVar3 == 0) {
                FSE_initDState((FSE_DState_t *)&state2_1.table,(BIT_DStream_t *)&state1_1.table,
                               (FSE_DTable *)((long)workSpace + 0x200));
                FSE_initDState((FSE_DState_t *)&_var_err___2,(BIT_DStream_t *)&state1_1.table,
                               (FSE_DTable *)((long)workSpace + 0x200));
                for (; BVar4 = BIT_reloadDStream((BIT_DStream_t *)&state1_1.table), pBVar9 = omax_1,
                    BVar4 == BIT_DStream_unfinished && omax_1 < pBVar6; omax_1 = omax_1 + 4) {
                  uVar2 = FSE_decodeSymbol((FSE_DState_t *)&state2_1.table,
                                           (BIT_DStream_t *)&state1_1.table);
                  *omax_1 = uVar2;
                  uVar2 = FSE_decodeSymbol((FSE_DState_t *)&_var_err___2,
                                           (BIT_DStream_t *)&state1_1.table);
                  omax_1[1] = uVar2;
                  uVar2 = FSE_decodeSymbol((FSE_DState_t *)&state2_1.table,
                                           (BIT_DStream_t *)&state1_1.table);
                  omax_1[2] = uVar2;
                  uVar2 = FSE_decodeSymbol((FSE_DState_t *)&_var_err___2,
                                           (BIT_DStream_t *)&state1_1.table);
                  omax_1[3] = uVar2;
                }
                do {
                  omax_1 = pBVar9;
                  if (pBVar1 + (sVar5 - 2) < omax_1) {
                    local_b8 = 0xffffffffffffffba;
                    goto LAB_00cb4f02;
                  }
                  uVar2 = FSE_decodeSymbol((FSE_DState_t *)&state2_1.table,
                                           (BIT_DStream_t *)&state1_1.table);
                  puVar8 = omax_1 + 1;
                  *omax_1 = uVar2;
                  BVar4 = BIT_reloadDStream((BIT_DStream_t *)&state1_1.table);
                  if (BVar4 == BIT_DStream_overflow) {
                    uVar2 = FSE_decodeSymbol((FSE_DState_t *)&_var_err___2,
                                             (BIT_DStream_t *)&state1_1.table);
                    omax_1 = omax_1 + 2;
                    *puVar8 = uVar2;
                    goto LAB_00cb4eea;
                  }
                  if (pBVar1 + (sVar5 - 2) < puVar8) {
                    local_b8 = 0xffffffffffffffba;
                    goto LAB_00cb4f02;
                  }
                  uVar2 = FSE_decodeSymbol((FSE_DState_t *)&_var_err___2,
                                           (BIT_DStream_t *)&state1_1.table);
                  pBVar9 = omax_1 + 2;
                  *puVar8 = uVar2;
                  BVar4 = BIT_reloadDStream((BIT_DStream_t *)&state1_1.table);
                } while (BVar4 != BIT_DStream_overflow);
                uVar2 = FSE_decodeSymbol((FSE_DState_t *)&state2_1.table,
                                         (BIT_DStream_t *)&state1_1.table);
                omax_1 = omax_1 + 3;
                *pBVar9 = uVar2;
LAB_00cb4eea:
                local_b8 = (long)omax_1 - (long)pBVar1;
              }
              else {
                local_b8 = local_158;
              }
LAB_00cb4f02:
              local_160 = local_b8;
            }
            else {
              omax = local_168;
              pBVar6 = local_168 + (local_170 - 3);
              local_10 = BIT_initDStream((BIT_DStream_t *)&state1.table,_maxSymbolValue,local_180);
              uVar3 = ERR_isError(local_10);
              if (uVar3 == 0) {
                FSE_initDState((FSE_DState_t *)&state2.table,(BIT_DStream_t *)&state1.table,
                               (FSE_DTable *)((long)workSpace + 0x200));
                FSE_initDState((FSE_DState_t *)&_var_err___1,(BIT_DStream_t *)&state1.table,
                               (FSE_DTable *)((long)workSpace + 0x200));
                for (; BVar4 = BIT_reloadDStream((BIT_DStream_t *)&state1.table), pBVar9 = omax,
                    BVar4 == BIT_DStream_unfinished && omax < pBVar6; omax = omax + 4) {
                  uVar2 = FSE_decodeSymbolFast
                                    ((FSE_DState_t *)&state2.table,(BIT_DStream_t *)&state1.table);
                  *omax = uVar2;
                  uVar2 = FSE_decodeSymbolFast
                                    ((FSE_DState_t *)&_var_err___1,(BIT_DStream_t *)&state1.table);
                  omax[1] = uVar2;
                  uVar2 = FSE_decodeSymbolFast
                                    ((FSE_DState_t *)&state2.table,(BIT_DStream_t *)&state1.table);
                  omax[2] = uVar2;
                  uVar2 = FSE_decodeSymbolFast
                                    ((FSE_DState_t *)&_var_err___1,(BIT_DStream_t *)&state1.table);
                  omax[3] = uVar2;
                }
                do {
                  omax = pBVar9;
                  if (pBVar1 + (sVar5 - 2) < omax) {
                    local_10 = 0xffffffffffffffba;
                    goto LAB_00cb4a1f;
                  }
                  uVar2 = FSE_decodeSymbolFast
                                    ((FSE_DState_t *)&state2.table,(BIT_DStream_t *)&state1.table);
                  puVar8 = omax + 1;
                  *omax = uVar2;
                  BVar4 = BIT_reloadDStream((BIT_DStream_t *)&state1.table);
                  if (BVar4 == BIT_DStream_overflow) {
                    uVar2 = FSE_decodeSymbolFast
                                      ((FSE_DState_t *)&_var_err___1,(BIT_DStream_t *)&state1.table)
                    ;
                    omax = omax + 2;
                    *puVar8 = uVar2;
                    goto LAB_00cb4a10;
                  }
                  if (pBVar1 + (sVar5 - 2) < puVar8) {
                    local_10 = 0xffffffffffffffba;
                    goto LAB_00cb4a1f;
                  }
                  uVar2 = FSE_decodeSymbolFast
                                    ((FSE_DState_t *)&_var_err___1,(BIT_DStream_t *)&state1.table);
                  pBVar9 = omax + 2;
                  *puVar8 = uVar2;
                  BVar4 = BIT_reloadDStream((BIT_DStream_t *)&state1.table);
                } while (BVar4 != BIT_DStream_overflow);
                uVar2 = FSE_decodeSymbolFast
                                  ((FSE_DState_t *)&state2.table,(BIT_DStream_t *)&state1.table);
                omax = omax + 3;
                *pBVar9 = uVar2;
LAB_00cb4a10:
                local_10 = (long)omax - (long)pBVar1;
              }
LAB_00cb4a1f:
              local_160 = local_10;
            }
          }
        }
      }
    }
  }
  return local_160;
}

Assistant:

static size_t FSE_decompress_wksp_body_default(void* dst, size_t dstCapacity, const void* cSrc, size_t cSrcSize, unsigned maxLog, void* workSpace, size_t wkspSize)
{
    return FSE_decompress_wksp_body(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize, 0);
}